

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMap(MapFieldBase *this)

{
  if (this->state_ != 0) {
    return;
  }
  Mutex::Lock(&this->mutex_);
  if (this->state_ == 0) {
    (*this->_vptr_MapFieldBase[10])(this);
    this->state_ = 2;
  }
  Mutex::Unlock(&this->mutex_);
  return;
}

Assistant:

void MapFieldBase::SyncRepeatedFieldWithMap() const {
  // "Acquire" insures the operation after SyncRepeatedFieldWithMap won't get
  // executed before state_ is checked.
  Atomic32 state = google::protobuf::internal::Acquire_Load(&state_);
  if (state == STATE_MODIFIED_MAP) {
    mutex_.Lock();
    // Double check state, because another thread may have seen the same state
    // and done the synchronization before the current thread.
    if (state_ == STATE_MODIFIED_MAP) {
      SyncRepeatedFieldWithMapNoLock();
      // "Release" insures state_ can only be changed "after"
      // SyncRepeatedFieldWithMapNoLock is finished.
      google::protobuf::internal::Release_Store(&state_, CLEAN);
    }
    mutex_.Unlock();
  }
}